

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplePursuit.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_73edc::MpPursuer::update(MpPursuer *this,float currentTime,float elapsedTime)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  Vec3 VVar7;
  Vec3 local_20;
  
  fVar1 = elapsedTime;
  uVar3 = (**(code **)((long)(this->super_MpBase).super_SimpleVehicle.super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0x40))();
  fVar2 = fVar1;
  uVar4 = (**(code **)((long)(this->wanderer->super_MpBase).super_SimpleVehicle.
                             super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0x40))();
  fVar5 = (float)uVar3 - (float)uVar4;
  fVar6 = (float)((ulong)uVar3 >> 0x20) - (float)((ulong)uVar4 >> 0x20);
  fVar1 = (fVar1 - fVar2) * (fVar1 - fVar2) + fVar5 * fVar5 + fVar6 * fVar6;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar2 = (float)(**(code **)((long)(this->super_MpBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                    .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                    super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this);
  fVar5 = (float)(**(code **)((long)(this->wanderer->super_MpBase).super_SimpleVehicle.
                                    super_SimpleVehicle_3.
                                    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                    .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                    super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))();
  if (fVar1 < fVar5 + fVar2) {
    reset(this);
  }
  VVar7 = OpenSteer::
          SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
          ::steerForPursuit((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                             *)this,(AbstractVehicle *)this->wanderer,20.0);
  fVar1 = VVar7.z;
  local_20._0_8_ = VVar7._0_8_;
  local_20.z = fVar1;
  OpenSteer::SimpleVehicle::applySteeringForce((SimpleVehicle *)this,&local_20,elapsedTime);
  local_20._0_8_ =
       (**(code **)((long)(this->super_MpBase).super_SimpleVehicle.super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
                          super_AbstractLocalSpace + 0x40))(this);
  local_20.z = fVar1;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  recordTrailVertex((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this
                    ,currentTime,&local_20);
  return;
}

Assistant:

void update (const float currentTime, const float elapsedTime)
        {
            // when pursuer touches quarry ("wanderer"), reset its position
            const float d = Vec3::distance (position(), wanderer->position());
            const float r = radius() + wanderer->radius();
            if (d < r) reset ();

            const float maxTime = 20; // xxx hard-to-justify value
            applySteeringForce (steerForPursuit (*wanderer, maxTime), elapsedTime);

            // for annotation
            recordTrailVertex (currentTime, position());
        }